

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Create64(int type,int ndim,int64_t *dims,char *name,int64_t *chunk)

{
  logical lVar1;
  long in_RDX;
  int in_ESI;
  long in_R8;
  int i_1;
  int i;
  Integer _ga_work [7];
  Integer _ga_dims [7];
  logical st;
  Integer g_a;
  Integer *ptr;
  int local_c0;
  int local_bc;
  Integer *in_stack_ffffffffffffff48;
  Integer *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  Integer *in_stack_ffffffffffffff60;
  Integer in_stack_ffffffffffffff68;
  Integer in_stack_ffffffffffffff70;
  undefined8 local_78 [8];
  int local_38;
  undefined1 *local_30;
  long local_28;
  long local_18;
  int local_c;
  int local_4;
  
  if (in_ESI < 8) {
    local_28 = in_R8;
    local_18 = in_RDX;
    local_c = in_ESI;
    for (local_bc = 0; local_bc < local_c; local_bc = local_bc + 1) {
      local_78[(local_c - local_bc) + -1] = *(undefined8 *)(local_18 + (long)local_bc * 8);
    }
    if (local_28 == 0) {
      local_30 = (undefined1 *)0x0;
    }
    else {
      for (local_c0 = 0; local_c0 < local_c; local_c0 = local_c0 + 1) {
        *(undefined8 *)(&stack0xffffffffffffff48 + (long)((local_c - local_c0) + -1) * 8) =
             *(undefined8 *)(local_28 + (long)local_c0 * 8);
      }
      local_30 = &stack0xffffffffffffff48;
    }
    lVar1 = pnga_create(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (lVar1 == 1) {
      local_4 = local_38;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int NGA_Create64(int type, int ndim, int64_t dims[], char *name, int64_t *chunk)
{
    Integer *ptr, g_a; 
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    if(!chunk)ptr=(Integer*)0;  
    else {
         COPYC2F(chunk,_ga_work, ndim);
         ptr = _ga_work;
    }
    st = wnga_create((Integer)type, (Integer)ndim, _ga_dims, name, ptr, &g_a);
    if(st==TRUE) return (int) g_a;
    else return 0;
}